

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeReadIOCallback.cpp
# Opt level: O0

void __thiscall
libebml::SafeReadIOCallback::SafeReadIOCallback(SafeReadIOCallback *this,EbmlBinary *Binary)

{
  MemReadIOCallback *this_00;
  EbmlBinary *Binary_local;
  SafeReadIOCallback *this_local;
  
  this_00 = (MemReadIOCallback *)operator_new(0x20);
  MemReadIOCallback::MemReadIOCallback(this_00,Binary);
  Init(this,(IOCallback *)this_00,true);
  return;
}

Assistant:

SafeReadIOCallback::SafeReadIOCallback(EbmlBinary const &Binary) {
  Init(new MemReadIOCallback(Binary), true);
}